

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DataType dataType)

{
  char *pcVar1;
  uint uVar2;
  ostringstream source;
  ostream oStack_188;
  ulong uVar3;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  uVar2 = (int)this - 0x2d;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 0x2e) {
    if ((0x102041UL >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x70000000000U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x380000000000U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_01367793;
        pcVar1 = "GL_OES_texture_storage_multisample_2d_array";
      }
      else {
        pcVar1 = "GL_EXT_texture_buffer";
      }
    }
    else {
      pcVar1 = "GL_EXT_texture_cube_map_array";
    }
    std::operator<<(&oStack_188,pcVar1);
  }
LAB_01367793:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string getDataTypeExtension (glu::DataType dataType)
{
	std::ostringstream source;
	switch (dataType)
	{
		case glu::TYPE_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW:
		case glu::TYPE_INT_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE_ARRAY:
			source << "GL_EXT_texture_cube_map_array";
			break;

		case glu::TYPE_SAMPLER_BUFFER:
		case glu::TYPE_INT_SAMPLER_BUFFER:
		case glu::TYPE_UINT_SAMPLER_BUFFER:
			source << "GL_EXT_texture_buffer";
			break;

		case glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY:
			source << "GL_OES_texture_storage_multisample_2d_array";
			break;

		default:
			break;
	}

	return source.str();
}